

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

bool __thiscall
glcts::ShaderBitfieldOperationCasePackSnorm::test
          (ShaderBitfieldOperationCasePackSnorm *this,Data *data)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  GLuint expected;
  Data *data_local;
  ShaderBitfieldOperationCasePackSnorm *this_local;
  
  fVar1 = ::deFloatFloor(data->inVec4[0] * 127.0 + 0.5);
  fVar2 = ::deFloatFloor(data->inVec4[1] * 127.0 + 0.5);
  fVar3 = ::deFloatFloor(data->inVec4[2] * 127.0 + 0.5);
  fVar4 = ::deFloatFloor(data->inVec4[3] * 127.0 + 0.5);
  return ((int)fVar1 & 0xffU | ((int)fVar2 & 0xffU) << 8 | ((int)fVar3 & 0xffU) << 0x10 |
         (int)fVar4 << 0x18) == data->outUvec4[0];
}

Assistant:

virtual bool test(Data const* data)
	{
		GLuint expected = ((int(deFloatFloor(data->inVec4[0] * 127.0f + 0.5f)) & 0xFF) << 0) |
						  ((int(deFloatFloor(data->inVec4[1] * 127.0f + 0.5f)) & 0xFF) << 8) |
						  ((int(deFloatFloor(data->inVec4[2] * 127.0f + 0.5f)) & 0xFF) << 16) |
						  ((int(deFloatFloor(data->inVec4[3] * 127.0f + 0.5f)) & 0xFF) << 24);
		if (expected != data->outUvec4[0])
		{
			return false;
		}
		return true;
	}